

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O1

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *first;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(first + 1);
    do {
      if (((ulong)(byte)*second == 0) || (max == 0)) break;
      if (""[bVar1] != ""[(byte)*second]) {
        max = 1;
        break;
      }
      max = max - 1;
      second = (char *)((byte *)second + 1);
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  if (max == 0) {
    return 1;
  }
  return (int)(""[bVar1] == ""[(byte)*second]);
}

Assistant:

int Curl_strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}